

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  string_t element;
  string_t element_00;
  string_t element_01;
  string_t element_02;
  UnifiedVectorFormat idata;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar2 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar3 = 0;
      uVar5 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = *(ulong *)(*(long *)(input + 0x28) + uVar3 * 8);
        }
        uVar4 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar4 = count;
        }
        uVar8 = uVar4;
        if (uVar6 != 0) {
          uVar8 = uVar5;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar5 < uVar4) {
              puVar7 = (undefined8 *)(uVar5 * 0x10 + lVar2 + 8);
              do {
                element.value.pointer.ptr = (char *)*puVar7;
                element.value._0_8_ = puVar7[-1];
                QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                          ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                           element,aggr_input_data);
                uVar5 = uVar5 + 1;
                puVar7 = puVar7 + 2;
                uVar8 = uVar5;
              } while (uVar4 != uVar5);
            }
          }
          else if (uVar5 < uVar4) {
            puVar7 = (undefined8 *)(uVar5 * 0x10 + lVar2 + 8);
            uVar8 = 0;
            do {
              if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
                element_00.value.pointer.ptr = (char *)*puVar7;
                element_00.value._0_8_ = puVar7[-1];
                QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                          ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                           element_00,aggr_input_data);
              }
              uVar8 = uVar8 + 1;
              puVar7 = puVar7 + 2;
            } while ((uVar5 - uVar4) + uVar8 != 0);
            uVar8 = uVar5 + uVar8;
          }
        }
        uVar3 = uVar3 + 1;
        uVar5 = uVar8;
      } while (uVar3 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      paVar1 = *(anon_union_16_2_67f50693_for_value **)(input + 0x20);
      do {
        QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                  ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                   (string_t)paVar1->pointer,aggr_input_data);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_68 == 0) {
      if (count != 0) {
        lVar2 = *local_78;
        uVar5 = 0;
        do {
          uVar3 = uVar5;
          if (lVar2 != 0) {
            uVar3 = (ulong)*(uint *)(lVar2 + uVar5 * 4);
          }
          element_02.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + uVar3 * 0x10);
          element_02.value._0_8_ = *(undefined8 *)(local_70 + uVar3 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,element_02
                     ,aggr_input_data);
          uVar5 = uVar5 + 1;
        } while (count != uVar5);
      }
    }
    else if (count != 0) {
      lVar2 = *local_78;
      uVar5 = 0;
      do {
        uVar3 = uVar5;
        if (lVar2 != 0) {
          uVar3 = (ulong)*(uint *)(lVar2 + uVar5 * 4);
        }
        if ((local_68 == 0) ||
           ((*(ulong *)(local_68 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
          element_01.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + uVar3 * 0x10);
          element_01.value._0_8_ = *(undefined8 *)(local_70 + uVar3 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,element_01
                     ,aggr_input_data);
        }
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}